

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O1

ParsedIR * __thiscall diligent_spirv_cross::ParsedIR::operator=(ParsedIR *this,ParsedIR *other)

{
  uint32_t uVar1;
  _Head_base<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_false> __p;
  long lVar2;
  
  if (this != other) {
    __p._M_head_impl =
         (other->pool_group)._M_t.
         super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolGroup,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
         ._M_t.
         super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
         .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
    (other->pool_group)._M_t.
    super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolGroup,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
    ._M_t.
    super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
    .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl =
         (ObjectPoolGroup *)0x0;
    ::std::
    __uniq_ptr_impl<diligent_spirv_cross::ObjectPoolGroup,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
    ::reset((__uniq_ptr_impl<diligent_spirv_cross::ObjectPoolGroup,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
             *)this,__p._M_head_impl);
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
              (&this->spirv,&other->spirv);
    ::std::
    _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_move_assign(&(this->meta)._M_h,&other->meta);
    lVar2 = 0;
    do {
      SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::operator=
                ((SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *)
                 (this->ids_for_type[0].stack_storage.aligned_char + lVar2 + -0x18),
                 (SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *)
                 (other->ids_for_type[0].stack_storage.aligned_char + lVar2 + -0x18));
      lVar2 = lVar2 + 0x38;
    } while (lVar2 != 0x310);
    SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::operator=
              (&this->ids_for_constant_undef_or_type,&other->ids_for_constant_undef_or_type);
    SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::operator=
              (&this->ids_for_constant_or_variable,&other->ids_for_constant_or_variable);
    SmallVector<spv::Capability,_8UL>::operator=
              (&this->declared_capabilities,&other->declared_capabilities);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::operator=(&this->declared_extensions,&other->declared_extensions);
    SmallVector<unsigned_char,_8UL>::operator=(&this->block_meta,&other->block_meta);
    ::std::
    _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_move_assign(&(this->continue_block_to_loop_header)._M_h,
                     &other->continue_block_to_loop_header);
    ::std::
    _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_diligent_spirv_cross::SPIREntryPoint>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_diligent_spirv_cross::SPIREntryPoint>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_move_assign(&(this->entry_points)._M_h,&other->entry_points);
    SmallVector<diligent_spirv_cross::Variant,_8UL>::operator=(&this->ids,&other->ids);
    this->addressing_model = other->addressing_model;
    this->memory_model = other->memory_model;
    (this->default_entry_point).id = (other->default_entry_point).id;
    uVar1 = (other->source).version;
    *(undefined4 *)((long)&(this->source).version + 3) =
         *(undefined4 *)((long)&(other->source).version + 3);
    (this->source).version = uVar1;
    this->loop_iteration_depth_hard = other->loop_iteration_depth_hard;
    this->loop_iteration_depth_soft = other->loop_iteration_depth_soft;
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_move_assign(&(this->meta_needing_name_fixup)._M_h,&other->meta_needing_name_fixup);
    ::std::
    _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_unsigned_int>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_move_assign(&(this->load_type_width)._M_h,&other->load_type_width);
  }
  return this;
}

Assistant:

ParsedIR &ParsedIR::operator=(ParsedIR &&other) SPIRV_CROSS_NOEXCEPT
{
	if (this != &other)
	{
		pool_group = std::move(other.pool_group);
		spirv = std::move(other.spirv);
		meta = std::move(other.meta);
		for (int i = 0; i < TypeCount; i++)
			ids_for_type[i] = std::move(other.ids_for_type[i]);
		ids_for_constant_undef_or_type = std::move(other.ids_for_constant_undef_or_type);
		ids_for_constant_or_variable = std::move(other.ids_for_constant_or_variable);
		declared_capabilities = std::move(other.declared_capabilities);
		declared_extensions = std::move(other.declared_extensions);
		block_meta = std::move(other.block_meta);
		continue_block_to_loop_header = std::move(other.continue_block_to_loop_header);
		entry_points = std::move(other.entry_points);
		ids = std::move(other.ids);
		addressing_model = other.addressing_model;
		memory_model = other.memory_model;

		default_entry_point = other.default_entry_point;
		source = other.source;
		loop_iteration_depth_hard = other.loop_iteration_depth_hard;
		loop_iteration_depth_soft = other.loop_iteration_depth_soft;

		meta_needing_name_fixup = std::move(other.meta_needing_name_fixup);
		load_type_width = std::move(other.load_type_width);
	}
	return *this;
}